

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall HashUtil_Hash160ByteData_Test::TestBody(HashUtil_Hash160ByteData_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_b8;
  Message local_b0;
  string local_a8;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  ByteData160 byte_data;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData target;
  HashUtil_Hash160ByteData_Test *this_local;
  
  target.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"0123456789abcdef",&local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::HashUtil::Hash160((ByteData160 *)&gtest_ar.message_,(ByteData *)local_28);
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_a8,(ByteData160 *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_88,"byte_data.GetHex().c_str()",
             "\"a956ed79819901b1b2c7b3ec045081f749c588ed\"",pcVar2,
             "a956ed79819901b1b2c7b3ec045081f749c588ed");
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)&gtest_ar.message_);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(HashUtil, Hash160ByteData) {
  ByteData target("0123456789abcdef");
  ByteData160 byte_data = HashUtil::Hash160(target);
  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "a956ed79819901b1b2c7b3ec045081f749c588ed");
}